

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_generate_nonce
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,size_t index)

{
  int iVar1;
  ulong in_RDX;
  long *in_RSI;
  long in_RDI;
  secp256k1_gej pubnon;
  secp256k1_fe *in_stack_00000138;
  secp256k1_gej *in_stack_00000140;
  secp256k1_gej *in_stack_00000148;
  secp256k1_gej *in_stack_00000150;
  char *in_stack_ffffffffffffff58;
  secp256k1_callback *in_stack_ffffffffffffff60;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffff80;
  secp256k1_gej *in_stack_ffffffffffffff88;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_context *in_stack_ffffffffffffff98;
  int local_4;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 8));
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else if (in_RSI == (long *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else if (in_RDX < (ulong)in_RSI[0x13]) {
    if (*(int *)(*in_RSI + in_RDX * 4) == 0) {
      iVar1 = secp256k1_aggsig_generate_nonce_single
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_gej_add_var
                  (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138);
        *(undefined4 *)(*in_RSI + in_RDX * 4) = 2;
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    secp256k1_callback_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_generate_nonce(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, size_t index) {
    secp256k1_gej pubnon;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(index < aggctx->n_sigs);

    if (aggctx->progress[index] != NONCE_PROGRESS_UNKNOWN) {
        return 0;
    }
    if (secp256k1_aggsig_generate_nonce_single(ctx, &aggctx->secnonce[index], &pubnon, &aggctx->rng) == 0){
        return 0;
    }

    secp256k1_gej_add_var(&aggctx->pubnonce_sum, &aggctx->pubnonce_sum, &pubnon, NULL);
    aggctx->progress[index] = NONCE_PROGRESS_OURS;
    return 1;
}